

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O2

HPDF_Stream HPDF_FileReader_New(HPDF_MMgr mmgr,char *fname)

{
  HPDF_Error error;
  FILE *pFVar1;
  HPDF_Stream s;
  int *piVar2;
  
  pFVar1 = fopen(fname,"rb");
  if (pFVar1 == (FILE *)0x0) {
    error = mmgr->error;
    piVar2 = __errno_location();
    HPDF_SetError(error,0x1017,(long)*piVar2);
  }
  else {
    s = (HPDF_Stream)HPDF_GetMem(mmgr,0x58);
    if (s != (HPDF_Stream)0x0) {
      HPDF_MemSet(s,'\0',0x58);
      s->sig_bytes = 0x5354524d;
      s->type = HPDF_STREAM_FILE;
      s->error = mmgr->error;
      s->mmgr = mmgr;
      s->read_fn = HPDF_FileReader_ReadFunc;
      s->seek_fn = HPDF_FileReader_SeekFunc;
      s->tell_fn = HPDF_FileStream_TellFunc;
      s->size_fn = HPDF_FileStream_SizeFunc;
      s->free_fn = HPDF_FileStream_FreeFunc;
      s->attr = pFVar1;
      return s;
    }
  }
  return (HPDF_Stream)0x0;
}

Assistant:

HPDF_Stream
HPDF_FileReader_New  (HPDF_MMgr   mmgr,
                      const char  *fname)
{
    HPDF_Stream stream;
    HPDF_FILEP fp = HPDF_FOPEN (fname, "rb");

    HPDF_PTRACE((" HPDF_FileReader_New\n"));

    if (!fp) {
#ifdef UNDER_CE
        HPDF_SetError (mmgr->error, HPDF_FILE_OPEN_ERROR, GetLastError());
#else
        HPDF_SetError (mmgr->error, HPDF_FILE_OPEN_ERROR, errno);
#endif
        return NULL;
    }

    stream = (HPDF_Stream)HPDF_GetMem(mmgr, sizeof(HPDF_Stream_Rec));

    if (stream) {
        HPDF_MemSet(stream, 0, sizeof(HPDF_Stream_Rec));
        stream->sig_bytes = HPDF_STREAM_SIG_BYTES;
        stream->type = HPDF_STREAM_FILE;
        stream->error = mmgr->error;
        stream->mmgr = mmgr;
        stream->read_fn = HPDF_FileReader_ReadFunc;
        stream->seek_fn = HPDF_FileReader_SeekFunc;
        stream->tell_fn = HPDF_FileStream_TellFunc;
        stream->size_fn = HPDF_FileStream_SizeFunc;
        stream->free_fn = HPDF_FileStream_FreeFunc;
        stream->attr = fp;
    }

    return stream;
}